

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.h
# Opt level: O0

void __thiscall google::CapturedStream::Capture(CapturedStream *this)

{
  int iVar1;
  char *__file;
  ostream *poVar2;
  LogMessage local_a0;
  LogMessageVoidify local_8a;
  byte local_89;
  LogMessage local_88;
  LogMessageVoidify local_72;
  byte local_71;
  LogMessage local_70;
  LogMessageVoidify local_59;
  int local_58;
  byte local_51;
  int cap_fd;
  LogMessageVoidify local_3d [20];
  byte local_29;
  LogMessage local_28;
  LogMessageVoidify local_11;
  CapturedStream *local_10;
  CapturedStream *this_local;
  
  local_29 = 0;
  local_10 = this;
  if (this->uncaptured_fd_ != -1) {
    LogMessageVoidify::LogMessageVoidify(&local_11);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x123);
    local_29 = 1;
    poVar2 = LogMessage::stream(&local_28);
    poVar2 = std::operator<<(poVar2,"Check failed: uncaptured_fd_ == -1 ");
    poVar2 = std::operator<<(poVar2,", Stream ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->fd_);
    poVar2 = std::operator<<(poVar2," already captured!");
    LogMessageVoidify::operator&(&local_11,poVar2);
  }
  if ((local_29 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
  }
  iVar1 = dup(this->fd_);
  this->uncaptured_fd_ = iVar1;
  local_51 = 0;
  if (this->uncaptured_fd_ == -1) {
    LogMessageVoidify::LogMessageVoidify(local_3d);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&cap_fd,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x125);
    local_51 = 1;
    poVar2 = LogMessage::stream((LogMessage *)&cap_fd);
    poVar2 = std::operator<<(poVar2,"Check failed: uncaptured_fd_ != -1 ");
    LogMessageVoidify::operator&(local_3d,poVar2);
  }
  if ((local_51 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&cap_fd);
  }
  __file = (char *)std::__cxx11::string::c_str();
  local_58 = open(__file,0x241,0x180);
  local_71 = 0;
  if (local_58 == -1) {
    LogMessageVoidify::LogMessageVoidify(&local_59);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,299);
    local_71 = 1;
    poVar2 = LogMessage::stream(&local_70);
    poVar2 = std::operator<<(poVar2,"Check failed: cap_fd != -1 ");
    LogMessageVoidify::operator&(&local_59,poVar2);
  }
  if ((local_71 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
  }
  fflush((FILE *)0x0);
  iVar1 = dup2(local_58,this->fd_);
  local_89 = 0;
  if (iVar1 == -1) {
    LogMessageVoidify::LogMessageVoidify(&local_72);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x12f);
    local_89 = 1;
    poVar2 = LogMessage::stream(&local_88);
    poVar2 = std::operator<<(poVar2,"Check failed: dup2(cap_fd, fd_) != -1 ");
    LogMessageVoidify::operator&(&local_72,poVar2);
  }
  if ((local_89 & 1) != 0) {
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
  }
  iVar1 = close(local_58);
  if (iVar1 == -1) {
    LogMessageVoidify::LogMessageVoidify(&local_8a);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/googletest.h"
               ,0x130);
    poVar2 = LogMessage::stream(&local_a0);
    poVar2 = std::operator<<(poVar2,"Check failed: close(cap_fd) != -1 ");
    LogMessageVoidify::operator&(&local_8a,poVar2);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_a0);
  }
  return;
}

Assistant:

void Capture() {
    // Keep original stream for later
    CHECK(uncaptured_fd_ == -1) << ", Stream " << fd_ << " already captured!";
    uncaptured_fd_ = dup(fd_);
    CHECK(uncaptured_fd_ != -1);

    // Open file to save stream to
    int cap_fd = open(filename_.c_str(),
                      O_CREAT | O_TRUNC | O_WRONLY,
                      S_IRUSR | S_IWUSR);
    CHECK(cap_fd != -1);

    // Send stdout/stderr to this file
    fflush(NULL);
    CHECK(dup2(cap_fd, fd_) != -1);
    CHECK(close(cap_fd) != -1);
  }